

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O1

int multinomial_coef1(int nfactor,int *factor)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  double dVar4;
  double dVar5;
  
  bVar1 = multicoef_check(nfactor,factor);
  if (bVar1) {
    if (nfactor < 1) {
      dVar4 = 1.0;
    }
    else {
      uVar3 = 0;
      iVar2 = 0;
      do {
        iVar2 = iVar2 + factor[uVar3];
        uVar3 = uVar3 + 1;
      } while ((uint)nfactor != uVar3);
      dVar4 = (double)(iVar2 + 1);
    }
    dVar4 = lgamma(dVar4);
    if (0 < nfactor) {
      uVar3 = 0;
      do {
        dVar5 = lgamma((double)(factor[uVar3] + 1));
        dVar4 = dVar4 - dVar5;
        uVar3 = uVar3 + 1;
      } while ((uint)nfactor != uVar3);
    }
    dVar4 = exp(dVar4);
    iVar2 = r8_nint(dVar4);
    return iVar2;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," \n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"MULTINOMIAL_COEF1 - Fatal error!\n",0x21);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"  MULTICOEF_CHECK failed.\n",0x1a);
  return -0x7fffffff;
}

Assistant:

int multinomial_coef1 ( int nfactor, int factor[] )

//****************************************************************************80
//
//  Purpose:
//
//    MULTINOMIAL_COEF1 computes a Multinomial coefficient.
//
//  Discussion:
//
//    The multinomial coefficient is a generalization of the binomial
//    coefficient.  It may be interpreted as the number of combinations of
//    N objects, where FACTOR(1) objects are indistinguishable of type 1,
//    ... and FACTOR(NFACTOR) are indistinguishable of type NFACTOR,
//    and N is the sum of FACTOR(1) through FACTOR(NFACTOR).
//
//    NCOMB = N! / ( FACTOR(1)! FACTOR(2)! ... FACTOR(NFACTOR)! )
//
//    The log of the gamma function is used, to avoid overflow.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    02 February 1999
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int NFACTOR, the number of factors.
//    1 <= NFACTOR.
//
//    Input, int FACTOR(NFACTOR), contains the factors.
//    0.0 <= FACTOR(I).
//
//    Output, int MULTINOMIAL_COEF1, the value of the multinomial coefficient.
//
{
  double facn;
  int i;
  int n;
  int ncomb;

  if (  !multicoef_check ( nfactor, factor ) )
  {
    cout << " \n";
    cout << "MULTINOMIAL_COEF1 - Fatal error!\n";
    cout << "  MULTICOEF_CHECK failed.\n";
    ncomb = -i4_huge ( );
    return ncomb;
  }
//
//  The factors sum to N.
//
  n = i4vec_sum ( nfactor, factor );

  facn = lgamma ( static_cast<double>(n + 1 ) );

  for ( i = 0; i < nfactor; i++ )
  {
    facn = facn - lgamma ( static_cast< double >( factor[i] + 1 ) );
  }

  ncomb = r8_nint ( exp ( facn ) );

  return ncomb;
}